

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O1

QPlatformTheme * QGenericUnixTheme::createUnixTheme(QString *name)

{
  long lVar1;
  char cVar2;
  long lVar3;
  QPlatformTheme *pQVar4;
  long lVar5;
  long lVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  
  if (QGenericUnixTheme::name == (char *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar3 = -1;
    do {
      lVar6 = lVar3 + 1;
      lVar5 = lVar3 + 1;
      lVar3 = lVar6;
    } while (QGenericUnixTheme::name[lVar5] != '\0');
  }
  lVar3 = (name->d).size;
  if ((lVar3 == lVar6) &&
     (QVar7.m_data = (name->d).ptr, QVar7.m_size = lVar3, QVar10.m_data = QGenericUnixTheme::name,
     QVar10.m_size = lVar6, cVar2 = QtPrivate::equalStrings(QVar7,QVar10), cVar2 != '\0')) {
    pQVar4 = (QPlatformTheme *)operator_new(0x10);
    QGenericUnixTheme((QGenericUnixTheme *)pQVar4);
  }
  else {
    if (QKdeTheme::name == (char *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar5 = -1;
      do {
        lVar6 = lVar5 + 1;
        lVar1 = lVar5 + 1;
        lVar5 = lVar6;
      } while (QKdeTheme::name[lVar1] != '\0');
    }
    if ((lVar3 == lVar6) &&
       (QVar8.m_data = (name->d).ptr, QVar8.m_size = lVar3, QVar11.m_data = QKdeTheme::name,
       QVar11.m_size = lVar6, cVar2 = QtPrivate::equalStrings(QVar8,QVar11), cVar2 != '\0')) {
      pQVar4 = QKdeTheme::createKdeTheme();
      return pQVar4;
    }
    if (QGnomeTheme::name == (char *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar5 = -1;
      do {
        lVar6 = lVar5 + 1;
        lVar1 = lVar5 + 1;
        lVar5 = lVar6;
      } while (QGnomeTheme::name[lVar1] != '\0');
    }
    if ((lVar3 == lVar6) &&
       (QVar9.m_data = (name->d).ptr, QVar9.m_size = lVar3, QVar12.m_data = QGnomeTheme::name,
       QVar12.m_size = lVar6, cVar2 = QtPrivate::equalStrings(QVar9,QVar12), cVar2 != '\0')) {
      pQVar4 = (QPlatformTheme *)operator_new(0x10);
      QGnomeTheme::QGnomeTheme((QGnomeTheme *)pQVar4);
    }
    else {
      pQVar4 = (QPlatformTheme *)0x0;
    }
  }
  return pQVar4;
}

Assistant:

QPlatformTheme *QGenericUnixTheme::createUnixTheme(const QString &name)
{
    if (name == QLatin1StringView(QGenericUnixTheme::name))
        return new QGenericUnixTheme;
#if QT_CONFIG(dbus) && QT_CONFIG(settings) && (QT_CONFIG(xcb) || QT_CONFIG(wayland))
    if (name == QLatin1StringView(QKdeTheme::name))
        return QKdeTheme::createKdeTheme();
#endif
    if (name == QLatin1StringView(QGnomeTheme::name))
        return new QGnomeTheme;
    return nullptr;
}